

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::writeVIndices
          (LibraryControllersLoader *this,sint64 *data,size_t length)

{
  undefined4 uVar1;
  undefined8 in_RAX;
  uint64 uVar2;
  uint64 uVar3;
  size_t i;
  size_t sVar4;
  uint index;
  undefined8 local_38;
  
  if (this->mCurrentSkinControllerData != (SkinControllerData *)0x0) {
    local_38 = in_RAX;
    for (sVar4 = 0; length != sVar4; sVar4 = sVar4 + 1) {
      uVar1 = (undefined4)data[sVar4];
      local_38 = CONCAT44(uVar1,(int)local_38);
      uVar2 = this->mCurrentOffset;
      if (uVar2 == this->mJointOffset) {
        local_38 = CONCAT44(uVar1,uVar1);
        COLLADAFW::ArrayPrimitiveType<int>::append
                  (&this->mCurrentSkinControllerData->mJointIndices,(int *)&local_38);
        uVar2 = this->mCurrentOffset;
      }
      if (uVar2 == this->mWeightsOffset) {
        COLLADAFW::ArrayPrimitiveType<unsigned_int>::append
                  (&this->mCurrentSkinControllerData->mWeightIndices,(uint *)((long)&local_38 + 4));
        uVar2 = this->mCurrentOffset;
      }
      uVar3 = 0;
      if (uVar2 != this->mCurrentMaxOffset) {
        uVar3 = uVar2 + 1;
      }
      this->mCurrentOffset = uVar3;
    }
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::writeVIndices ( const sint64* data, size_t length )
	{
		// check, if we are parsing an unsupported primitive type
		if ( !mCurrentSkinControllerData )
			return true;

		// Write the index values in the index lists.
		for ( size_t i=0; i<length; ++i )
		{
			// Get the current index value.
			unsigned int index = (unsigned int)data [i];

			// Write the indices
			if (  mCurrentOffset == mJointOffset )
			{
				COLLADAFW::IntValuesArray& jointIndices = mCurrentSkinControllerData->getJointIndices();
				jointIndices.append ( index );
			}

			if ( mCurrentOffset == mWeightsOffset )
			{
				COLLADAFW::UIntValuesArray& weightIndices = mCurrentSkinControllerData->getWeightIndices();
				weightIndices.append ( index );
			}

			// Reset the offset if we went through all offset values
			if ( mCurrentOffset == mCurrentMaxOffset )
			{
				// Reset the current offset value
				mCurrentOffset = 0;
			}
			else
			{
				// Increment the current offset value
				++mCurrentOffset;
			}
		}
		return true;
	}